

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O2

void __thiscall libtorrent::aux::session_impl::try_connect_more_peers(session_impl *this)

{
  pointer pptVar1;
  pointer pptVar2;
  _Elt_pointer ppVar3;
  size_t sVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  pointer pptVar9;
  pointer pptVar10;
  torrent *this_00;
  pointer pptVar11;
  session_settings *this_01;
  int local_5c;
  __shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  if (this->m_abort == false) {
    sVar4 = (this->m_connections)._M_t._M_impl.super__Rb_tree_header._M_node_count;
    this_01 = &this->m_settings;
    iVar6 = session_settings::get_int(this_01,0x4055);
    if ((int)sVar4 < iVar6) {
      local_5c = session_settings::get_int(this_01,0x4012);
      iVar6 = this->m_boost_connections;
      if (0 < iVar6) {
        if (iVar6 - local_5c != 0 && local_5c <= iVar6) {
          this->m_boost_connections = iVar6 - local_5c;
          return;
        }
        local_5c = local_5c - iVar6;
        this->m_boost_connections = 0;
      }
      if (0 < local_5c) {
        iVar6 = session_settings::get_int(this_01,0x4055);
        sVar4 = (this->m_connections)._M_t._M_impl.super__Rb_tree_header._M_node_count;
        bVar5 = session_settings::get_bool(this_01,0x802c);
        if (bVar5) {
          iVar6 = iVar6 - (int)sVar4;
          if (0x7ffffffd < iVar6) {
            iVar6 = 0x7ffffffe;
          }
          iVar6 = (iVar6 + 1) / 2;
          if (iVar6 <= local_5c) {
            local_5c = iVar6;
          }
        }
        pptVar1 = (this->m_torrent_lists).
                  super_array<libtorrent::aux::container_wrapper<libtorrent::aux::torrent_*,_int,_std::vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>_>,_8UL>
                  ._M_elems[2].
                  super_vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>
                  .
                  super__Vector_base<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pptVar2 = *(pointer *)
                   ((long)&(this->m_torrent_lists).
                           super_array<libtorrent::aux::container_wrapper<libtorrent::aux::torrent_*,_int,_std::vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>_>,_8UL>
                           ._M_elems[2].
                           super_vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>
                           .
                           super__Vector_base<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>
                           ._M_impl.super__Vector_impl_data + 8);
        if (pptVar1 == pptVar2) {
          pptVar10 = (this->m_torrent_lists).
                     super_array<libtorrent::aux::container_wrapper<libtorrent::aux::torrent_*,_int,_std::vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>_>,_8UL>
                     ._M_elems[3].
                     super_vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>
                     .
                     super__Vector_base<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          pptVar11 = *(pointer *)
                      ((long)&(this->m_torrent_lists).
                              super_array<libtorrent::aux::container_wrapper<libtorrent::aux::torrent_*,_int,_std::vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>_>,_8UL>
                              ._M_elems[3].
                              super_vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>
                              .
                              super__Vector_base<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>
                              ._M_impl.super__Vector_impl_data + 8);
          if (pptVar10 == pptVar11) {
            return;
          }
          if (local_5c < 1) {
            return;
          }
        }
        else {
          if (local_5c < 1) {
            return;
          }
          pptVar10 = (this->m_torrent_lists).
                     super_array<libtorrent::aux::container_wrapper<libtorrent::aux::torrent_*,_int,_std::vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>_>,_8UL>
                     ._M_elems[3].
                     super_vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>
                     .
                     super__Vector_base<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          pptVar11 = *(pointer *)
                      ((long)&(this->m_torrent_lists).
                              super_array<libtorrent::aux::container_wrapper<libtorrent::aux::torrent_*,_int,_std::vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>_>,_8UL>
                              ._M_elems[3].
                              super_vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>
                              .
                              super__Vector_base<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>
                              ._M_impl.super__Vector_impl_data + 8);
        }
        iVar6 = 0;
        do {
          if ((int)((ulong)((long)*(pointer *)
                                   ((long)&(this->m_torrent_lists).
                                           super_array<libtorrent::aux::container_wrapper<libtorrent::aux::torrent_*,_int,_std::vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>_>,_8UL>
                                           ._M_elems[2].
                                           super_vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>
                                           .
                                           super__Vector_base<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>
                                           ._M_impl.super__Vector_impl_data + 8) -
                           (long)(this->m_torrent_lists).
                                 super_array<libtorrent::aux::container_wrapper<libtorrent::aux::torrent_*,_int,_std::vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>_>,_8UL>
                                 ._M_elems[2].
                                 super_vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>
                                 .
                                 super__Vector_base<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 3) <=
              this->m_next_downloading_connect_torrent) {
            this->m_next_downloading_connect_torrent = 0;
          }
          if ((int)((ulong)((long)*(pointer *)
                                   ((long)&(this->m_torrent_lists).
                                           super_array<libtorrent::aux::container_wrapper<libtorrent::aux::torrent_*,_int,_std::vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>_>,_8UL>
                                           ._M_elems[3].
                                           super_vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>
                                           .
                                           super__Vector_base<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>
                                           ._M_impl.super__Vector_impl_data + 8) -
                           (long)(this->m_torrent_lists).
                                 super_array<libtorrent::aux::container_wrapper<libtorrent::aux::torrent_*,_int,_std::vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>_>,_8UL>
                                 ._M_elems[3].
                                 super_vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>
                                 .
                                 super__Vector_base<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 3) <=
              this->m_next_finished_connect_torrent) {
            this->m_next_finished_connect_torrent = 0;
          }
          while ((this->m_prio_torrents).
                 super__Deque_base<std::pair<std::weak_ptr<libtorrent::aux::torrent>,_int>,_std::allocator<std::pair<std::weak_ptr<libtorrent::aux::torrent>,_int>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
                 (this->m_prio_torrents).
                 super__Deque_base<std::pair<std::weak_ptr<libtorrent::aux::torrent>,_int>,_std::allocator<std::pair<std::weak_ptr<libtorrent::aux::torrent>,_int>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_cur) {
            ::std::__shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                      (&local_40);
            this_00 = local_40._M_ptr;
            ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&local_40._M_refcount);
            ppVar3 = (this->m_prio_torrents).
                     super__Deque_base<std::pair<std::weak_ptr<libtorrent::aux::torrent>,_int>,_std::allocator<std::pair<std::weak_ptr<libtorrent::aux::torrent>,_int>_>_>
                     ._M_impl.super__Deque_impl_data._M_start._M_cur;
            iVar8 = ppVar3->second;
            ppVar3->second = iVar8 + -1;
            if ((this_00 != (torrent *)0x0 && 1 < iVar8) &&
               (bVar5 = torrent::want_peers(this_00), bVar5)) goto LAB_0029291f;
            ::std::
            deque<std::pair<std::weak_ptr<libtorrent::aux::torrent>,_int>,_std::allocator<std::pair<std::weak_ptr<libtorrent::aux::torrent>,_int>_>_>
            ::pop_front(&this->m_prio_torrents);
          }
          iVar8 = this->m_download_connect_attempts;
          iVar7 = session_settings::get_int(this_01,0x4072);
          if ((iVar8 < iVar7) ||
             (pptVar9 = (this->m_torrent_lists).
                        super_array<libtorrent::aux::container_wrapper<libtorrent::aux::torrent_*,_int,_std::vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>_>,_8UL>
                        ._M_elems[3].
                        super_vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>
                        .
                        super__Vector_base<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>
                        ._M_impl.super__Vector_impl_data._M_start,
             pptVar9 ==
             *(pointer *)
              ((long)&(this->m_torrent_lists).
                      super_array<libtorrent::aux::container_wrapper<libtorrent::aux::torrent_*,_int,_std::vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>_>,_8UL>
                      ._M_elems[3].
                      super_vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>
                      .
                      super__Vector_base<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>
                      ._M_impl.super__Vector_impl_data + 8))) {
            pptVar9 = (this->m_torrent_lists).
                      super_array<libtorrent::aux::container_wrapper<libtorrent::aux::torrent_*,_int,_std::vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>_>,_8UL>
                      ._M_elems[2].
                      super_vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>
                      .
                      super__Vector_base<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if (pptVar9 ==
                *(pointer *)
                 ((long)&(this->m_torrent_lists).
                         super_array<libtorrent::aux::container_wrapper<libtorrent::aux::torrent_*,_int,_std::vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>_>,_8UL>
                         ._M_elems[2].
                         super_vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>
                         .
                         super__Vector_base<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>
                         ._M_impl.super__Vector_impl_data + 8)) {
              pptVar9 = (this->m_torrent_lists).
                        super_array<libtorrent::aux::container_wrapper<libtorrent::aux::torrent_*,_int,_std::vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>_>,_8UL>
                        ._M_elems[3].
                        super_vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>
                        .
                        super__Vector_base<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              goto LAB_00292904;
            }
            this_00 = pptVar9[this->m_next_downloading_connect_torrent];
            this->m_download_connect_attempts = this->m_download_connect_attempts + 1;
            this->m_next_downloading_connect_torrent = this->m_next_downloading_connect_torrent + 1;
          }
          else {
LAB_00292904:
            this_00 = pptVar9[this->m_next_finished_connect_torrent];
            this->m_download_connect_attempts = 0;
            this->m_next_finished_connect_torrent = this->m_next_finished_connect_torrent + 1;
          }
LAB_0029291f:
          bVar5 = torrent::try_connect_peer(this_00);
          if (bVar5) {
            local_5c = local_5c + -1;
            counters::inc_stats_counter(&this->m_stats_counters,0x33,1);
            iVar6 = 0;
          }
          if (local_5c == 0) {
            return;
          }
          if (((this->m_torrent_lists).
               super_array<libtorrent::aux::container_wrapper<libtorrent::aux::torrent_*,_int,_std::vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>_>,_8UL>
               ._M_elems[2].
               super_vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>
               .
               super__Vector_base<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>
               ._M_impl.super__Vector_impl_data._M_start ==
               *(pointer *)
                ((long)&(this->m_torrent_lists).
                        super_array<libtorrent::aux::container_wrapper<libtorrent::aux::torrent_*,_int,_std::vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>_>,_8UL>
                        ._M_elems[2].
                        super_vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>
                        .
                        super__Vector_base<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>
                        ._M_impl.super__Vector_impl_data + 8)) &&
             ((this->m_torrent_lists).
              super_array<libtorrent::aux::container_wrapper<libtorrent::aux::torrent_*,_int,_std::vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>_>,_8UL>
              ._M_elems[3].
              super_vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>.
              super__Vector_base<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>
              ._M_impl.super__Vector_impl_data._M_start ==
              *(pointer *)
               ((long)&(this->m_torrent_lists).
                       super_array<libtorrent::aux::container_wrapper<libtorrent::aux::torrent_*,_int,_std::vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>_>,_8UL>
                       ._M_elems[3].
                       super_vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>
                       .
                       super__Vector_base<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>
                       ._M_impl.super__Vector_impl_data + 8))) {
            return;
          }
          if ((int)((ulong)((long)pptVar11 - (long)pptVar10) >> 3) +
              (int)((ulong)((long)pptVar2 - (long)pptVar1) >> 3) < iVar6) {
            return;
          }
          iVar6 = iVar6 + 1;
          sVar4 = (this->m_connections)._M_t._M_impl.super__Rb_tree_header._M_node_count;
          iVar8 = session_settings::get_int(this_01,0x4055);
        } while ((int)sVar4 < iVar8);
      }
    }
  }
  return;
}

Assistant:

void session_impl::try_connect_more_peers()
	{
		if (m_abort) return;

		if (num_connections() >= m_settings.get_int(settings_pack::connections_limit))
			return;

		// this is the maximum number of connections we will
		// attempt this tick
		int max_connections = m_settings.get_int(settings_pack::connection_speed);

		// this loop will "hand out" connection_speed to the torrents, in a round
		// robin fashion, so that every torrent is equally likely to connect to a
		// peer

		// boost connections are connections made by torrent connection
		// boost, which are done immediately on a tracker response. These
		// connections needs to be deducted from the regular connection attempt
		// quota for this tick
		if (m_boost_connections > 0)
		{
			if (m_boost_connections > max_connections)
			{
				m_boost_connections -= max_connections;
				max_connections = 0;
			}
			else
			{
				max_connections -= m_boost_connections;
				m_boost_connections = 0;
			}
		}

		// zero connections speeds are allowed, we just won't make any connections
		if (max_connections <= 0) return;

		// TODO: use a lower limit than m_settings.connections_limit
		// to allocate the to 10% or so of connection slots for incoming
		// connections
		// cap this at max - 1, since we may add one below
		int const limit = std::min(m_settings.get_int(settings_pack::connections_limit)
			- num_connections(), std::numeric_limits<int>::max() - 1);

		// this logic is here to smooth out the number of new connection
		// attempts over time, to prevent connecting a large number of
		// sockets, wait 10 seconds, and then try again
		if (m_settings.get_bool(settings_pack::smooth_connects) && max_connections > (limit+1) / 2)
			max_connections = (limit + 1) / 2;

		aux::vector<torrent*>& want_peers_download = m_torrent_lists[torrent_want_peers_download];
		aux::vector<torrent*>& want_peers_finished = m_torrent_lists[torrent_want_peers_finished];

		// if no torrent want any peers, just return
		if (want_peers_download.empty() && want_peers_finished.empty()) return;

		// if we don't have any connection attempt quota, return
		if (max_connections <= 0) return;

		int steps_since_last_connect = 0;
		int const num_torrents = int(want_peers_finished.size() + want_peers_download.size());
		for (;;)
		{
			if (m_next_downloading_connect_torrent >= int(want_peers_download.size()))
				m_next_downloading_connect_torrent = 0;

			if (m_next_finished_connect_torrent >= int(want_peers_finished.size()))
				m_next_finished_connect_torrent = 0;

			torrent* t = nullptr;
			// there are prioritized torrents. Pick one of those
			while (!m_prio_torrents.empty())
			{
				t = m_prio_torrents.front().first.lock().get();
				--m_prio_torrents.front().second;
				if (m_prio_torrents.front().second > 0
					&& t != nullptr
					&& t->want_peers()) break;
				m_prio_torrents.pop_front();
				t = nullptr;
			}

			if (t == nullptr)
			{
				if ((m_download_connect_attempts >= m_settings.get_int(
						settings_pack::connect_seed_every_n_download)
					&& !want_peers_finished.empty())
						|| want_peers_download.empty())
				{
					// pick a finished torrent to give a peer to
					t = want_peers_finished[m_next_finished_connect_torrent];
					TORRENT_ASSERT(t->want_peers_finished());
					m_download_connect_attempts = 0;
					++m_next_finished_connect_torrent;
				}
				else
				{
					// pick a downloading torrent to give a peer to
					t = want_peers_download[m_next_downloading_connect_torrent];
					TORRENT_ASSERT(t->want_peers_download());
					++m_download_connect_attempts;
					++m_next_downloading_connect_torrent;
				}
			}

			TORRENT_ASSERT(t->want_peers());
			TORRENT_ASSERT(!t->is_torrent_paused());

			if (t->try_connect_peer())
			{
				--max_connections;
				steps_since_last_connect = 0;
				m_stats_counters.inc_stats_counter(counters::connection_attempts);
			}

			++steps_since_last_connect;

			// if there are no more free connection slots, abort
			if (max_connections == 0) return;
			// there are no more torrents that want peers
			if (want_peers_download.empty() && want_peers_finished.empty()) break;
			// if we have gone a whole loop without
			// handing out a single connection, break
			if (steps_since_last_connect > num_torrents + 1) break;
			// maintain the global limit on number of connections
			if (num_connections() >= m_settings.get_int(settings_pack::connections_limit)) break;
		}
	}